

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

void __thiscall Imf_3_2::Image::clearChannels(Image *this)

{
  long lVar1;
  long *plVar2;
  int x;
  long lVar3;
  long lVar4;
  int y;
  long lVar5;
  
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < (this->_levels)._sizeX; lVar5 = lVar5 + 1) {
    for (lVar3 = 0; lVar1 = (this->_levels)._sizeY, lVar3 < lVar1; lVar3 = lVar3 + 1) {
      plVar2 = *(long **)((long)(this->_levels)._data + lVar3 * 8 + lVar1 * lVar4);
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 0x30))();
      }
    }
    lVar4 = lVar4 + 8;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
  ::clear(&(this->_channels)._M_t);
  return;
}

Assistant:

void
Image::clearChannels ()
{
    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            if (_levels[y][x]) _levels[y][x]->clearChannels ();

    _channels.clear ();
}